

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argParserAdvancedConfiguration.cpp
# Opt level: O2

string * __thiscall
argParserAdvancedConfiguration::generateAutoCompletion_abi_cxx11_
          (string *__return_storage_ptr__,argParserAdvancedConfiguration *this)

{
  value_type __rhs;
  reference ppsVar1;
  reference ppaVar2;
  vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
  *this_00;
  ulong __n;
  string topLevelArgs;
  ulong local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,"#/usr/bin/env bash\n_function()\n{\n\n",
             (allocator *)&local_90);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  for (__n = 0; this_00 = this->newargconfig,
      __n < (ulong)((long)(this_00->
                          super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this_00->
                          super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 3); __n = __n + 1) {
    local_d8 = 0;
    while( true ) {
      ppsVar1 = std::
                vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                ::at(this_00,__n);
      if ((ulong)((long)((*ppsVar1)->arguments->
                        super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)((*ppsVar1)->arguments->
                        super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 3) <= local_d8) break;
      ppsVar1 = std::
                vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                ::at(this->newargconfig,__n);
      ppaVar2 = std::
                vector<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                ::at((*ppsVar1)->arguments,local_d8);
      __rhs = *ppaVar2;
      std::operator+(&local_d0,&__rhs->argLong," ");
      std::__cxx11::string::append((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_d0);
      std::operator+(&local_70,"if [ \"${COMP_WORDS[${COMP_CWORD} -1 ]}\" == \"",&__rhs->argLong);
      std::operator+(&local_50,&local_70,"\" ] || [ \"${COMP_WORDS[${COMP_CWORD} -1 ]}\" == \"");
      std::operator+(&local_b0,&local_50,&__rhs->argShort);
      std::operator+(&local_d0,&local_b0,"\" ]; then\n");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      if (__rhs->enumIsFile == true) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        std::operator+(&local_b0,"     COMPREPLY=($(compgen -W \"",&__rhs->enums);
        std::operator+(&local_d0,&local_b0,"\" -- \"${COMP_WORDS[${COMP_CWORD}]}\"))   \n");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_b0);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      local_d8 = local_d8 + 1;
      this_00 = this->newargconfig;
    }
  }
  std::operator+(&local_b0,"se\n     COMPREPLY=($(compgen -W \"",&local_90);
  std::operator+(&local_d0,&local_b0,"\" -- \"${COMP_WORDS[${COMP_CWORD}]}\"))   \n");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)&autoCompletionScript_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_90);
  return __return_storage_ptr__;
}

Assistant:

string argParserAdvancedConfiguration::generateAutoCompletion() {

    string script = "#/usr/bin/env bash\n_function()\n{\n\n";
    argument * arg;
    string topLevelArgs;
    for (int i = 0; i < newargconfig->size(); i++) {
        for(int y = 0; y<newargconfig->at(i)->arguments->size();y++){
            arg = newargconfig->at(i)->arguments->at(y);
            topLevelArgs += arg->argLong + " ";
            script += R"(if [ "${COMP_WORDS[${COMP_CWORD} -1 ]}" == ")" + arg->argLong +
                      R"(" ] || [ "${COMP_WORDS[${COMP_CWORD} -1 ]}" == ")" + arg->argShort +
                      "\" ]; then\n";
            if (arg->enumIsFile) {
                script += "    compopt -o nospace -o dirnames -o filenames\n"
                          "    COMPREPLY=($(compgen  -f \"${COMP_WORDS[${COMP_CWORD}]}\"))      \n";
            } else {
                script += "     COMPREPLY=($(compgen -W \"" + arg->enums +
                          "\" -- \"${COMP_WORDS[${COMP_CWORD}]}\"))   \n";
            }
            script += "\n   el";
        }
    }


    script += "se\n     COMPREPLY=($(compgen -W \"" + topLevelArgs + "\" -- \"${COMP_WORDS[${COMP_CWORD}]}\"))   \n";
    script += "  fi\n compgen -o bashdefault\n}\n";
    script += "complete -F _function ";
    autoCompletionScript = script;
    return script;

}